

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::Block::ByteSizeLong(Block *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *pMVar5;
  const_pointer pvVar6;
  long lVar7;
  undefined1 local_98 [4];
  int cached_size;
  undefined1 local_80 [8];
  const_iterator it;
  Operation *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::MILSpec::Operation> *__range2_1;
  int n;
  int i;
  NamedValueType *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  Block *this_local;
  
  iVar2 = _internal_inputs_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::begin
                     (&this->inputs_);
  msg = (NamedValueType *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::end
                  (&this->inputs_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::
                 operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::operator*
                      (&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::NamedValueType>(value);
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::operator++(&__end2);
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->outputs_);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_18 = sVar3 + sStack_18;
  __range2_1._4_4_ = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->outputs_);
  for (; __range2_1._4_4_ < iVar2; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
    pbVar4 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(&this->outputs_,__range2_1._4_4_);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(pbVar4);
    sStack_18 = sVar3 + sStack_18;
  }
  iVar2 = _internal_operations_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::begin
                       (&this->operations_);
  msg_1 = (Operation *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Operation>::end
                    (&this->operations_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Operation>::operator!=
                           (&__end2_1,(iterator *)&msg_1), bVar1) {
    it.it_.bucket_index_ =
         (size_type)
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Operation>::operator*(&__end2_1);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Operation>
                      ((Operation *)it.it_.bucket_index_);
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Operation>
    ::operator++(&__end2_1);
  }
  iVar2 = _internal_attributes_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_18 = sVar3 + sStack_18;
  pMVar5 = _internal_attributes_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::begin((const_iterator *)local_80,pMVar5);
  while( true ) {
    pMVar5 = _internal_attributes_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::end((const_iterator *)local_98,pMVar5);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_80,(const_iterator *)local_98);
    if (!bVar1) break;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
             ::const_iterator::operator->((const_iterator *)local_80);
    pvVar6 = google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
             ::const_iterator::operator->((const_iterator *)local_80);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(pbVar4,(Value *)(pvVar6 + 0x20));
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::const_iterator::operator++((const_iterator *)local_80);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    sStack_18 = lVar7 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t Block::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Block)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.NamedValueType inputs = 1;
  total_size += 1UL * this->_internal_inputs_size();
  for (const auto& msg : this->inputs_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string outputs = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(outputs_.size());
  for (int i = 0, n = outputs_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      outputs_.Get(i));
  }

  // repeated .CoreML.Specification.MILSpec.Operation operations = 3;
  total_size += 1UL * this->_internal_operations_size();
  for (const auto& msg : this->operations_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 4;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_attributes_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
      it = this->_internal_attributes().begin();
      it != this->_internal_attributes().end(); ++it) {
    total_size += Block_AttributesEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}